

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::con_<64l,7l,7l,2,2,0,0>::
backward<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::subnet_wrapper>
          (con_<64L,_7L,_7L,_2,_2,_0,_0> *this,tensor *gradient_input,subnet_wrapper *sub,
          tensor *params_grad)

{
  tensor *gradient_input_00;
  tensor *in_RCX;
  subnet_wrapper *in_RDX;
  long in_RDI;
  alias_tensor_instance b;
  alias_tensor_instance filt;
  size_t in_stack_00000128;
  tensor *in_stack_00000130;
  tensor *in_stack_fffffffffffffea8;
  tensor *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 uVar1;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 uVar2;
  
  uVar1 = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
  alias_tensor::operator()((alias_tensor *)params_grad,in_stack_00000130,in_stack_00000128);
  add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::subnet_wrapper::
  get_gradient_input((subnet_wrapper *)in_stack_fffffffffffffeb0);
  tt::tensor_conv::get_gradient_for_data
            ((tensor_conv *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (bool)uVar1,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(tensor *)0x20d14f);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20d15e);
  if ((*(double *)(in_RDI + 0x148) != 0.0) || (NAN(*(double *)(in_RDI + 0x148)))) {
    uVar2 = 0;
    alias_tensor::operator()((alias_tensor *)params_grad,in_stack_00000130,in_stack_00000128);
    uVar1 = (undefined1)((ulong)(in_RDI + 0x128) >> 0x38);
    add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::subnet_wrapper::
    get_output(in_RDX);
    tt::tensor_conv::get_gradient_for_filters
              ((tensor_conv *)CONCAT44(uVar2,in_stack_fffffffffffffec0),(bool)uVar1,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(tensor *)0x20d1ef);
    if ((*(byte *)(in_RDI + 0x178) & 1) != 0) {
      gradient_input_00 = (tensor *)(in_RDI + 0xe0);
      alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
      alias_tensor::operator()((alias_tensor *)params_grad,in_stack_00000130,in_stack_00000128);
      tt::assign_conv_bias_gradient(in_RCX,gradient_input_00);
      alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20d264);
    }
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20d2cc);
  }
  return;
}

Assistant:

void backward(const tensor& gradient_input, SUBNET& sub, tensor& params_grad)
        {
            conv.get_gradient_for_data (true, gradient_input, filters(params,0), sub.get_gradient_input());
            // no point computing the parameter gradients if they won't be used.
            if (learning_rate_multiplier != 0)
            {
                auto filt = filters(params_grad,0);
                conv.get_gradient_for_filters (false, gradient_input, sub.get_output(), filt);
                if (use_bias)
                {
                    auto b = biases(params_grad, filters.size());
                    tt::assign_conv_bias_gradient(b, gradient_input);
                }
            }
        }